

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void TableSetupColumnFlags
               (ImGuiTable *table,ImGuiTableColumn *column,ImGuiTableColumnFlags flags_in)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint in_EDX;
  ImSpan<ImGuiTableColumn> *in_RSI;
  long in_RDI;
  int list;
  int mask;
  int count;
  ImGuiTableFlags table_sizing_policy;
  ImGuiTableColumnFlags flags;
  uint uVar4;
  uint uVar5;
  uint in_stack_ffffffffffffffe4;
  
  if ((in_EDX & 0xc) == 0) {
    in_stack_ffffffffffffffe4 = *(uint *)(in_RDI + 4) & 0xe000;
    if ((in_stack_ffffffffffffffe4 == 0x2000) || (in_stack_ffffffffffffffe4 == 0x4000)) {
      uVar2 = in_EDX | 8;
    }
    else {
      uVar2 = in_EDX | 4;
    }
  }
  else {
    uVar4 = in_EDX;
    bVar1 = ImIsPowerOfTwo(in_EDX & 0xc);
    uVar2 = in_EDX;
    in_EDX = uVar4;
    if (!bVar1) {
      __assert_fail("ImIsPowerOfTwo(flags & ImGuiTableColumnFlags_WidthMask_)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                    ,0x27c,
                    "void TableSetupColumnFlags(ImGuiTable *, ImGuiTableColumn *, ImGuiTableColumnFlags)"
                   );
    }
  }
  if ((*(uint *)(in_RDI + 4) & 1) == 0) {
    uVar2 = uVar2 | 0x10;
  }
  if (((uVar2 & 0x200) != 0) && ((uVar2 & 0x400) != 0)) {
    uVar2 = uVar2 | 0x100;
  }
  if ((uVar2 & 0xc000) == 0) {
    iVar3 = ImSpan<ImGuiTableColumn>::index_from_ptr
                      (in_RSI,(ImGuiTableColumn *)CONCAT44(in_EDX,uVar2));
    uVar4 = 0x8000;
    if (iVar3 == 0) {
      uVar4 = 0x4000;
    }
    uVar2 = uVar4 | uVar2;
  }
  *(uint *)&in_RSI->Data = uVar2 | *(uint *)&in_RSI->Data & 0xf00000;
  *(undefined1 *)((long)&in_RSI[6].Data + 5) = 0;
  *(byte *)((long)&in_RSI[6].Data + 4) = *(byte *)((long)&in_RSI[6].Data + 4) & 0xf;
  *(byte *)((long)&in_RSI[6].Data + 4) = *(byte *)((long)&in_RSI[6].Data + 4) & 0xf3;
  if ((*(uint *)(in_RDI + 4) & 8) != 0) {
    iVar3 = 0;
    uVar5 = 0;
    uVar4 = 0;
    if (((uVar2 & 0x1000) != 0) && ((uVar2 & 0x200) == 0)) {
      uVar5 = 2;
      uVar4 = 1;
      iVar3 = 1;
    }
    if (((uVar2 & 0x2000) != 0) && ((uVar2 & 0x400) == 0)) {
      uVar5 = uVar5 | 4;
      uVar4 = 2 << (sbyte)(iVar3 << 1) | uVar4;
      iVar3 = iVar3 + 1;
    }
    if (((uVar2 & 0x1000) == 0) && ((uVar2 & 0x200) == 0)) {
      uVar5 = uVar5 | 2;
      uVar4 = 1 << (sbyte)(iVar3 << 1) | uVar4;
      iVar3 = iVar3 + 1;
    }
    if (((uVar2 & 0x2000) == 0) && ((uVar2 & 0x400) == 0)) {
      uVar5 = uVar5 | 4;
      uVar4 = 2 << (sbyte)(iVar3 << 1) | uVar4;
      iVar3 = iVar3 + 1;
    }
    if (((*(uint *)(in_RDI + 4) & 0x8000000) != 0) || (iVar3 == 0)) {
      uVar5 = uVar5 | 1;
      iVar3 = iVar3 + 1;
    }
    *(char *)((long)&in_RSI[6].Data + 5) = (char)uVar4;
    *(byte *)((long)&in_RSI[6].Data + 4) =
         *(byte *)((long)&in_RSI[6].Data + 4) & 0xf | (char)uVar5 << 4;
    *(byte *)((long)&in_RSI[6].Data + 4) =
         *(byte *)((long)&in_RSI[6].Data + 4) & 0xf3 | ((byte)iVar3 & 3) << 2;
    ImGui::TableFixColumnSortDirection
              ((ImGuiTable *)CONCAT44(in_stack_ffffffffffffffe4,iVar3),
               (ImGuiTableColumn *)CONCAT44(uVar5,uVar4));
  }
  return;
}

Assistant:

static void TableSetupColumnFlags(ImGuiTable* table, ImGuiTableColumn* column, ImGuiTableColumnFlags flags_in)
{
    ImGuiTableColumnFlags flags = flags_in;

    // Sizing Policy
    if ((flags & ImGuiTableColumnFlags_WidthMask_) == 0)
    {
        const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
        if (table_sizing_policy == ImGuiTableFlags_SizingFixedFit || table_sizing_policy == ImGuiTableFlags_SizingFixedSame)
            flags |= ImGuiTableColumnFlags_WidthFixed;
        else
            flags |= ImGuiTableColumnFlags_WidthStretch;
    }
    else
    {
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiTableColumnFlags_WidthMask_)); // Check that only 1 of each set is used.
    }
    
    // Resize
    if ((table->Flags & ImGuiTableFlags_Resizable) == 0)
        flags |= ImGuiTableColumnFlags_NoResize;

    // Sorting
    if ((flags & ImGuiTableColumnFlags_NoSortAscending) && (flags & ImGuiTableColumnFlags_NoSortDescending))
        flags |= ImGuiTableColumnFlags_NoSort;

    // Indentation
    if ((flags & ImGuiTableColumnFlags_IndentMask_) == 0)
        flags |= (table->Columns.index_from_ptr(column) == 0) ? ImGuiTableColumnFlags_IndentEnable : ImGuiTableColumnFlags_IndentDisable;

    // Alignment
    //if ((flags & ImGuiTableColumnFlags_AlignMask_) == 0)
    //    flags |= ImGuiTableColumnFlags_AlignCenter;
    //IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiTableColumnFlags_AlignMask_)); // Check that only 1 of each set is used.

    // Preserve status flags
    column->Flags = flags | (column->Flags & ImGuiTableColumnFlags_StatusMask_);

    // Build an ordered list of available sort directions
    column->SortDirectionsAvailCount = column->SortDirectionsAvailMask = column->SortDirectionsAvailList = 0;
    if (table->Flags & ImGuiTableFlags_Sortable)
    {
        int count = 0, mask = 0, list = 0;
        if ((flags & ImGuiTableColumnFlags_PreferSortAscending)  != 0 && (flags & ImGuiTableColumnFlags_NoSortAscending)  == 0) { mask |= 1 << ImGuiSortDirection_Ascending;  list |= ImGuiSortDirection_Ascending  << (count << 1); count++; }
        if ((flags & ImGuiTableColumnFlags_PreferSortDescending) != 0 && (flags & ImGuiTableColumnFlags_NoSortDescending) == 0) { mask |= 1 << ImGuiSortDirection_Descending; list |= ImGuiSortDirection_Descending << (count << 1); count++; }
        if ((flags & ImGuiTableColumnFlags_PreferSortAscending)  == 0 && (flags & ImGuiTableColumnFlags_NoSortAscending)  == 0) { mask |= 1 << ImGuiSortDirection_Ascending;  list |= ImGuiSortDirection_Ascending  << (count << 1); count++; }
        if ((flags & ImGuiTableColumnFlags_PreferSortDescending) == 0 && (flags & ImGuiTableColumnFlags_NoSortDescending) == 0) { mask |= 1 << ImGuiSortDirection_Descending; list |= ImGuiSortDirection_Descending << (count << 1); count++; }
        if ((table->Flags & ImGuiTableFlags_SortTristate) || count == 0) { mask |= 1 << ImGuiSortDirection_None; count++; }
        column->SortDirectionsAvailList = (ImU8)list;
        column->SortDirectionsAvailMask = (ImU8)mask;
        column->SortDirectionsAvailCount = (ImU8)count;
        ImGui::TableFixColumnSortDirection(table, column);
    }
}